

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O0

void __thiscall
cmCTestMultiProcessHandler::StartTestProcess(cmCTestMultiProcessHandler *this,int test)

{
  cmCTest *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  undefined8 uVar1;
  bool bVar2;
  int n;
  ostream *poVar3;
  char *msg;
  mapped_type_conflict1 *pmVar4;
  size_t sVar5;
  cmCTestRunTest *this_02;
  mapped_type *ppcVar6;
  pointer ppVar7;
  bool collapse;
  _Self local_210;
  _Self local_208;
  iterator j;
  undefined1 local_1e8 [8];
  string current_dir;
  cmCTestRunTest *testRun;
  ostringstream local_190 [8];
  ostringstream cmCTestLog_msg;
  int local_14;
  cmCTestMultiProcessHandler *pcStack_10;
  int test_local;
  cmCTestMultiProcessHandler *this_local;
  
  local_14 = test;
  pcStack_10 = this;
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar3 = std::operator<<((ostream *)local_190,"test ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_14);
  std::operator<<(poVar3,"\n");
  this_00 = this->CTest;
  std::__cxx11::ostringstream::str();
  msg = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(this_00,4,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
               ,0x7f,msg,(bool)(this->Quiet & 1));
  std::__cxx11::string::~string((string *)&testRun);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  pmVar4 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
           operator[](&this->TestRunningMap,&local_14);
  *pmVar4 = true;
  EraseTest(this,local_14);
  sVar5 = GetProcessorsUsed(this,local_14);
  this->RunningCount = this->RunningCount + sVar5;
  this_02 = (cmCTestRunTest *)operator_new(0x210);
  cmCTestRunTest::cmCTestRunTest(this_02,this->TestHandler);
  current_dir.field_2._8_8_ = this_02;
  bVar2 = cmCTest::GetRepeatUntilFail(this->CTest);
  if (bVar2) {
    cmCTestRunTest::SetRunUntilFailOn((cmCTestRunTest *)current_dir.field_2._8_8_);
    uVar1 = current_dir.field_2._8_8_;
    n = cmCTest::GetTestRepeat(this->CTest);
    cmCTestRunTest::SetNumberOfRuns((cmCTestRunTest *)uVar1,n);
  }
  cmCTestRunTest::SetIndex((cmCTestRunTest *)current_dir.field_2._8_8_,local_14);
  uVar1 = current_dir.field_2._8_8_;
  ppcVar6 = std::
            map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
            ::operator[](&(this->Properties).
                          super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                         ,&local_14);
  cmCTestRunTest::SetTestProperties((cmCTestRunTest *)uVar1,*ppcVar6);
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
            ((string *)local_1e8,(SystemTools *)0x1,collapse);
  ppcVar6 = std::
            map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
            ::operator[](&(this->Properties).
                          super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                         ,&local_14);
  cmsys::SystemTools::ChangeDirectory(&(*ppcVar6)->Directory);
  LockResources(this,local_14);
  bVar2 = cmCTestRunTest::StartTest((cmCTestRunTest *)current_dir.field_2._8_8_,this->Total);
  if (bVar2) {
    std::set<cmCTestRunTest_*,_std::less<cmCTestRunTest_*>,_std::allocator<cmCTestRunTest_*>_>::
    insert(&this->RunningTests,(value_type *)((long)&current_dir.field_2 + 8));
  }
  else {
    bVar2 = cmCTestRunTest::IsStopTimePassed((cmCTestRunTest *)current_dir.field_2._8_8_);
    uVar1 = current_dir.field_2._8_8_;
    if (bVar2) {
      this->StopTimePassed = true;
      if (current_dir.field_2._8_8_ != 0) {
        cmCTestRunTest::~cmCTestRunTest((cmCTestRunTest *)current_dir.field_2._8_8_);
        operator_delete((void *)uVar1,0x210);
      }
      j._M_node._4_4_ = 1;
      goto LAB_00598307;
    }
    local_208._M_node =
         (_Base_ptr)
         std::
         map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
         ::begin(&(this->Tests).
                  super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
                );
    while( true ) {
      local_210._M_node =
           (_Base_ptr)
           std::
           map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
           ::end(&(this->Tests).
                  super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
                );
      bVar2 = std::operator!=(&local_208,&local_210);
      if (!bVar2) break;
      ppVar7 = std::_Rb_tree_iterator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>::
               operator->(&local_208);
      std::set<int,_std::less<int>,_std::allocator<int>_>::erase
                (&(ppVar7->second).super_set<int,_std::less<int>,_std::allocator<int>_>,&local_14);
      std::_Rb_tree_iterator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>::operator++
                (&local_208);
    }
    UnlockResources(this,local_14);
    this->Completed = this->Completed + 1;
    pmVar4 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
             operator[](&this->TestFinishMap,&local_14);
    *pmVar4 = true;
    pmVar4 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
             operator[](&this->TestRunningMap,&local_14);
    *pmVar4 = false;
    sVar5 = GetProcessorsUsed(this,local_14);
    this->RunningCount = this->RunningCount - sVar5;
    cmCTestRunTest::EndTest
              ((cmCTestRunTest *)current_dir.field_2._8_8_,this->Completed,this->Total,false);
    this_01 = this->Failed;
    ppcVar6 = std::
              map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
              ::operator[](&(this->Properties).
                            super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                           ,&local_14);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(this_01,&(*ppcVar6)->Name);
    uVar1 = current_dir.field_2._8_8_;
    if (current_dir.field_2._8_8_ != 0) {
      cmCTestRunTest::~cmCTestRunTest((cmCTestRunTest *)current_dir.field_2._8_8_);
      operator_delete((void *)uVar1,0x210);
    }
  }
  cmsys::SystemTools::ChangeDirectory((string *)local_1e8);
  j._M_node._4_4_ = 0;
LAB_00598307:
  std::__cxx11::string::~string((string *)local_1e8);
  return;
}

Assistant:

void cmCTestMultiProcessHandler::StartTestProcess(int test)
{
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
    "test " << test << "\n", this->Quiet);
  this->TestRunningMap[test] = true; // mark the test as running
  // now remove the test itself
  this->EraseTest(test);
  this->RunningCount += GetProcessorsUsed(test);

  cmCTestRunTest* testRun = new cmCTestRunTest(this->TestHandler);
  if(this->CTest->GetRepeatUntilFail())
    {
    testRun->SetRunUntilFailOn();
    testRun->SetNumberOfRuns(this->CTest->GetTestRepeat());
    }
  testRun->SetIndex(test);
  testRun->SetTestProperties(this->Properties[test]);

  std::string current_dir = cmSystemTools::GetCurrentWorkingDirectory();
  cmSystemTools::ChangeDirectory(this->Properties[test]->Directory);

  // Lock the resources we'll be using
  this->LockResources(test);

  if(testRun->StartTest(this->Total))
    {
    this->RunningTests.insert(testRun);
    }
  else if(testRun->IsStopTimePassed())
    {
    this->StopTimePassed = true;
    delete testRun;
    return;
    }
  else
    {

    for(TestMap::iterator j = this->Tests.begin();
      j != this->Tests.end(); ++j)
      {
      j->second.erase(test);
      }

    this->UnlockResources(test);
    this->Completed++;
    this->TestFinishMap[test] = true;
    this->TestRunningMap[test] = false;
    this->RunningCount -= GetProcessorsUsed(test);
    testRun->EndTest(this->Completed, this->Total, false);
    this->Failed->push_back(this->Properties[test]->Name);
    delete testRun;
    }
  cmSystemTools::ChangeDirectory(current_dir);
}